

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

cali_configset_t cali_create_configset(char *(*keyvallist) [2])

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this;
  char *(*papcVar1) [2];
  pair<const_char_*,_const_char_*> local_28;
  
  this = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          *)operator_new(0x30);
  *(undefined4 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    **)(this + 0x18) = this + 8;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    **)(this + 0x20) = this + 8;
  *(undefined8 *)(this + 0x28) = 0;
  if ((keyvallist != (char *(*) [2])0x0) &&
     (local_28.first = (*keyvallist)[0], local_28.first != (char *)0x0)) {
    papcVar1 = keyvallist + 1;
    do {
      local_28.second = papcVar1[-1][1];
      if (local_28.second == (char *)0x0) {
        return (cali_configset_t)this;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<char_const*,char_const*>>(this,&local_28);
      local_28.first = (*papcVar1)[0];
      papcVar1 = papcVar1 + 1;
    } while (local_28.first != (char *)0x0);
  }
  return (cali_configset_t)this;
}

Assistant:

cali_configset_t cali_create_configset(const char* keyvallist[][2])
{
    cali_configset_t cfg = new _cali_configset_t;

    if (!keyvallist)
        return cfg;

    for (; (*keyvallist)[0] && (*keyvallist)[1]; ++keyvallist)
        cfg->cfgset.insert(std::make_pair((*keyvallist)[0], (*keyvallist)[1]));

    return cfg;
}